

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unsigned_cast.hpp
# Opt level: O2

uint pstore::unsigned_cast<int,unsigned_int,void>(int value)

{
  if (-1 < value) {
    return value;
  }
  assert_failed("value >= SrcT{0}",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/unsigned_cast.hpp"
                ,0x22);
}

Assistant:

constexpr DestT unsigned_cast (SrcT const value) noexcept {
        static_assert (
            std::numeric_limits<DestT>::max () >=
                std::numeric_limits<std::make_unsigned_t<typename std::remove_cv_t<SrcT>>>::max (),
            "DestT cannot hold all of the values of SrcT");
        PSTORE_ASSERT (value >= SrcT{0});
        return static_cast<DestT> (value);
    }